

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O2

void kws_search_free(ps_search_t *search)

{
  int iVar1;
  char *pcVar2;
  undefined8 *ptr;
  long lVar3;
  char **ppcVar4;
  double dVar5;
  
  iVar1 = *(int *)&search[2].type;
  lVar3 = ps_config_int(search->config,"frate");
  dVar5 = (double)iVar1 / (double)lVar3;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_search.c"
          ,0x1c8,"TOTAL kws %.2f CPU %.3f xRT\n",*(double *)&search[1].post,
          *(double *)&search[1].post / dVar5);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_search.c"
          ,0x1cb,"TOTAL kws %.2f wall %.3f xRT\n",*(double *)&search[1].start_wid,
          *(double *)&search[1].start_wid / dVar5);
  ps_search_base_free(search);
  hmm_context_free((hmm_context_t *)search[1].vt);
  kws_detections_reset((kws_detections_t *)search[1].name);
  ckd_free(search[1].name);
  ckd_free(search[1].d2p);
  ppcVar4 = &search[1].type;
  while (pcVar2 = *ppcVar4, pcVar2 != (char *)0x0) {
    ptr = *(undefined8 **)pcVar2;
    ckd_free((void *)ptr[2]);
    ckd_free((void *)*ptr);
    ckd_free(ptr);
    ppcVar4 = (char **)(pcVar2 + 8);
  }
  glist_free((glist_t)search[1].type);
  ckd_free(search);
  return;
}

Assistant:

void
kws_search_free(ps_search_t * search)
{
    kws_search_t *kwss;
    double n_speech;
    gnode_t *gn;

    kwss = (kws_search_t *) search;

    n_speech = (double)kwss->n_tot_frame
        / ps_config_int(ps_search_config(kwss), "frate");

    E_INFO("TOTAL kws %.2f CPU %.3f xRT\n",
           kwss->perf.t_tot_cpu,
           kwss->perf.t_tot_cpu / n_speech);
    E_INFO("TOTAL kws %.2f wall %.3f xRT\n",
           kwss->perf.t_tot_elapsed,
           kwss->perf.t_tot_elapsed / n_speech);


    ps_search_base_free(search);
    hmm_context_free(kwss->hmmctx);
    kws_detections_reset(kwss->detections);
    ckd_free(kwss->detections);

    ckd_free(kwss->pl_hmms);
    for (gn = kwss->keyphrases; gn; gn = gnode_next(gn)) {
	kws_keyphrase_t *keyphrase = gnode_ptr(gn);
        ckd_free(keyphrase->hmms);
        ckd_free(keyphrase->word);
        ckd_free(keyphrase);
    }
    glist_free(kwss->keyphrases);
    ckd_free(kwss);
}